

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.cpp
# Opt level: O0

FormatInformation ZXing::QRCode::FormatInformation::DecodeMQR(uint32_t formatInfoBits)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  uint32_t uVar1;
  undefined4 in_EDI;
  FormatInformation FVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  uint8_t BITS_TO_VERSION [8];
  FormatInformation fi;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  allocator_type *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  size_type in_stack_ffffffffffffff80;
  undefined1 *puVar4;
  undefined4 local_44;
  undefined4 *local_40;
  undefined8 local_38;
  undefined4 local_14;
  uint32_t local_10;
  byte bStack_c;
  uint8_t uStack_b;
  uint8_t uStack_a;
  bool bStack_9;
  byte local_8;
  uint8_t uStack_7;
  undefined2 uStack_6;
  ErrorCorrectionLevel EStack_4;
  
  local_44 = 0x4445;
  local_40 = &local_44;
  local_38 = 1;
  local_14 = in_EDI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2fbae7);
  __l._M_array._4_4_ = in_stack_ffffffffffffff7c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff78;
  __l._M_len = in_stack_ffffffffffffff80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff70,__l,in_stack_ffffffffffffff68);
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff7c;
  uVar1 = MirrorBits(0);
  uVar3 = local_14;
  *(uint32_t *)
   &(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = uVar1;
  puVar4 = &stack0xffffffffffffff78;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2fbb5f);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffff7c;
  __l_00._M_array._0_4_ = uVar3;
  __l_00._M_len = (size_type)puVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff70,__l_00,in_stack_ffffffffffffff68);
  FVar2 = FindBestFormatInfo(in_stack_00000010,in_stack_00000008);
  local_10 = FVar2.mask;
  bStack_c = FVar2.data;
  uStack_b = FVar2.hammingDistance;
  uStack_a = FVar2.bitsIndex;
  bStack_9 = FVar2.isMirrored;
  local_8 = FVar2.dataMask;
  uStack_7 = FVar2.microVersion;
  uStack_6 = FVar2._10_2_;
  EStack_4 = FVar2.ecLevel;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2fbbc4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2fbbde);
  EStack_4 = ECLevelFromBits((CONCAT12(uStack_a,CONCAT11(uStack_b,bStack_c)) & 0x1c) >> 2,true);
  local_8 = bStack_c & 3;
  FVar2.data = bStack_c;
  FVar2.mask = local_10;
  FVar2.hammingDistance = uStack_b;
  FVar2.bitsIndex = uStack_a;
  FVar2.isMirrored = uStack_a == '\x01';
  FVar2.dataMask = bStack_c & 3;
  FVar2.microVersion =
       (&stack0xffffffffffffff68)[(CONCAT12(uStack_a,CONCAT11(uStack_b,bStack_c)) & 0x1c) >> 2];
  FVar2._10_2_ = uStack_6;
  FVar2.ecLevel = EStack_4;
  return FVar2;
}

Assistant:

FormatInformation FormatInformation::DecodeMQR(uint32_t formatInfoBits)
{
	auto fi = FindBestFormatInfo({FORMAT_INFO_MASK_MICRO}, {formatInfoBits, MirrorBits(formatInfoBits)});

	constexpr uint8_t BITS_TO_VERSION[] = {1, 2, 2, 3, 3, 4, 4, 4};

	// Bits 2/3/4 contain both error correction level and version, 0/1 contain mask.
	fi.ecLevel = ECLevelFromBits((fi.data >> 2) & 0x07, true);
	fi.dataMask = static_cast<uint8_t>(fi.data & 0x03);
	fi.microVersion = BITS_TO_VERSION[(fi.data >> 2) & 0x07];
	fi.isMirrored = fi.bitsIndex == 1;

	return fi;
}